

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
          (SmallVector<llvm::DWARFFormValue,_3U> *this,SmallVector<llvm::DWARFFormValue,_3U> *RHS)

{
  bool bVar1;
  SmallVector<llvm::DWARFFormValue,_3U> *RHS_local;
  SmallVector<llvm::DWARFFormValue,_3U> *this_local;
  
  SmallVectorImpl<llvm::DWARFFormValue>::SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFFormValue>,3);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<llvm::DWARFFormValue>::operator=
              (&this->super_SmallVectorImpl<llvm::DWARFFormValue>,
               &RHS->super_SmallVectorImpl<llvm::DWARFFormValue>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }